

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void __thiscall mir::inst::BasicBlk::BasicBlk(BasicBlk *this,BasicBlk *param_1)

{
  pointer puVar1;
  int iVar2;
  
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed448;
  this->id = param_1->id;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->preceding)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->preceding)._M_t._M_impl.super__Rb_tree_header);
  puVar1 = (param_1->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->inst).
       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->inst).
       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->inst).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jump).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed408;
  (this->jump).kind = (param_1->jump).kind;
  (this->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
  if ((param_1->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    (this->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    (this->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
         (param_1->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
         .super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
    (this->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  (this->jump).jump_kind = (param_1->jump).jump_kind;
  iVar2 = (param_1->jump).bb_false;
  (this->jump).bb_true = (param_1->jump).bb_true;
  (this->jump).bb_false = iVar2;
  return;
}

Assistant:

BasicBlk(BasicBlk&&) = default;